

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedPathAlikeUtilities.h
# Opt level: O2

size_t OpenSteer::previousSegment<OpenSteer::PolylineSegmentedPathwaySegmentRadii>
                 (PolylineSegmentedPathwaySegmentRadii *pathAlike,size_t segmentIndex)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  
  if (segmentIndex != 0) {
    return segmentIndex - 1;
  }
  iVar1 = (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[6])();
  if ((char)iVar1 == '\0') {
    sVar2 = 0;
  }
  else {
    iVar1 = (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])(pathAlike);
    sVar2 = CONCAT44(extraout_var,iVar1) - 1;
  }
  return sVar2;
}

Assistant:

size_t previousSegment( SegmentedPathAlike const& pathAlike, size_t segmentIndex ) {
        assert( pathAlike.isValid() && "pathAlike isn't valid." );
        assert( segmentIndex < pathAlike.segmentCount() && "segmentIndex out of range." );
        

        if ( 0 != segmentIndex ) {
            --segmentIndex;

        } else if ( pathAlike.isCyclic() ) {
            segmentIndex = pathAlike.segmentCount() - 1;
        }
        
        return segmentIndex;
    }